

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_s_w_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float32 fVar1;
  int iVar2;
  float32 fVar3;
  int iVar4;
  float32 fVar5;
  int iVar6;
  long lVar7;
  
  fVar3 = (env->active_fpu).fpr[ws].fs[0];
  lVar7 = (long)(int)fVar3;
  fVar1 = (env->active_fpu).fpr[wt].fs[0];
  fVar3 = fVar1 + fVar3;
  if (lVar7 < 0) {
    fVar5 = 0x80000000;
    if (-0x80000000 - lVar7 < (long)(int)fVar1) {
      fVar5 = fVar3;
    }
  }
  else {
    fVar5 = 0x7fffffff;
    if ((long)(int)fVar1 < 0x7fffffff - lVar7) {
      fVar5 = fVar3;
    }
  }
  (env->active_fpu).fpr[wd].fs[0] = fVar5;
  iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  lVar7 = (long)iVar4;
  iVar2 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  iVar4 = iVar2 + iVar4;
  if (lVar7 < 0) {
    iVar6 = -0x80000000;
    if (-0x80000000 - lVar7 < (long)iVar2) {
      iVar6 = iVar4;
    }
  }
  else {
    iVar6 = 0x7fffffff;
    if ((long)iVar2 < 0x7fffffff - lVar7) {
      iVar6 = iVar4;
    }
  }
  *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = iVar6;
  iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  lVar7 = (long)iVar4;
  iVar2 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  iVar4 = iVar2 + iVar4;
  if (lVar7 < 0) {
    iVar6 = -0x80000000;
    if (-0x80000000 - lVar7 < (long)iVar2) {
      iVar6 = iVar4;
    }
  }
  else {
    iVar6 = 0x7fffffff;
    if ((long)iVar2 < 0x7fffffff - lVar7) {
      iVar6 = iVar4;
    }
  }
  *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = iVar6;
  iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  lVar7 = (long)iVar4;
  iVar2 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  iVar4 = iVar2 + iVar4;
  if (lVar7 < 0) {
    iVar6 = -0x80000000;
    if (-0x80000000 - lVar7 < (long)iVar2) {
      iVar6 = iVar4;
    }
  }
  else {
    iVar6 = 0x7fffffff;
    if ((long)iVar2 < 0x7fffffff - lVar7) {
      iVar6 = iVar4;
    }
  }
  *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = iVar6;
  return;
}

Assistant:

void helper_msa_adds_s_w(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_adds_s_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_adds_s_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_adds_s_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_adds_s_df(DF_WORD, pws->w[3],  pwt->w[3]);
}